

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleListDecoder.h
# Opt level: O1

void __thiscall
o3dgc::TriangleListDecoder<unsigned_short>::TriangleListDecoder
          (TriangleListDecoder<unsigned_short> *this)

{
  long *plVar1;
  
  (this->m_vertexToTriangle).m_numElements = 0;
  (this->m_vertexToTriangle).m_neighborsSize = 0x10;
  (this->m_vertexToTriangle).m_numNeighborsSize = 0x10;
  plVar1 = (long *)operator_new__(0x80);
  (this->m_vertexToTriangle).m_numNeighbors = plVar1;
  plVar1 = (long *)operator_new__(0x80);
  (this->m_vertexToTriangle).m_neighbors = plVar1;
  memset(&this->m_ctfans,0,0xa4);
  (this->m_tfans).m_numTFANs = 0;
  (this->m_tfans).m_numVertices = 0;
  (this->m_tfans).m_verticesAllocatedSize = 0x80;
  (this->m_tfans).m_sizeTFANAllocatedSize = 8;
  plVar1 = (long *)operator_new__(0x40);
  (this->m_tfans).m_sizeTFAN = plVar1;
  plVar1 = (long *)operator_new__(0x400);
  (this->m_tfans).m_vertices = plVar1;
  this->m_decodeTrianglesOrder = false;
  this->m_decodeVerticesOrder = false;
  memset(this,0,0x90);
  return;
}

Assistant:

TriangleListDecoder(void)
                                    {
                                        m_vertexCount            = 0;
                                        m_triangleCount          = 0;
                                        m_numTriangles           = 0;
                                        m_numVertices            = 0;
                                        m_triangles              = 0;
                                        m_numConqueredTriangles  = 0;
                                        m_numVisitedVertices     = 0;
                                        m_visitedVertices        = 0;
                                        m_visitedVerticesValence = 0;
                                        m_maxNumVertices         = 0;
                                        m_maxNumTriangles        = 0;
                                        m_itNumTFans             = 0;
                                        m_itDegree               = 0;
                                        m_itConfig               = 0;
                                        m_itOperation            = 0;
                                        m_itIndex                = 0;
                                        m_tempTriangles          = 0;
                                        m_tempTrianglesSize      = 0;
                                        m_decodeTrianglesOrder   = false;
                                        m_decodeVerticesOrder    = false;
                                    }